

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O1

int Dau_InsertFunction(Abc_TtHieMan_t *pMan,word *pCur,int nNodes,int nInputs,int nVars0,int nVars,
                      Vec_Mem_t *vTtMem,Vec_Int_t *vNodSup,int nFronts,abctime clk)

{
  ulong uVar1;
  word wVar2;
  uint uVar3;
  ulong uVar4;
  word *pwVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  word *pwVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  word *pwVar15;
  word *pwVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  word *pwVar20;
  ulong uVar21;
  uint nVars_00;
  word *pwVar22;
  word *pLimit;
  char Perm [16];
  char local_48 [24];
  
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  if (nInputs < nVars) {
    __assert_fail("nVars <= nVarsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  if (nVars < 1) {
    nVars_00 = 0;
  }
  else {
    iVar8 = nInputs + -6;
    uVar12 = 1 << ((byte)iVar8 & 0x1f);
    pwVar9 = pCur + (int)uVar12;
    if ((int)uVar12 < 2) {
      uVar12 = 1;
    }
    uVar13 = 0;
    nVars_00 = 0;
    do {
      if (uVar13 == (uint)nInputs) {
        __assert_fail("iVar < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x582,"int Abc_TtHasVar(word *, int, int)");
      }
      bVar6 = (byte)uVar13;
      if (nInputs < 7) {
        if ((s_Truths6Neg[uVar13] & (*pCur >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^ *pCur)) != 0) {
LAB_00512ebf:
          lVar10 = (long)(int)nVars_00;
          if (lVar10 < (long)uVar13) {
            if ((long)nInputs <= (long)uVar13) {
              __assert_fail("iVar < jVar && jVar < nVars",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                            ,0x692,"void Abc_TtSwapVars(word *, int, int, int)");
            }
            bVar7 = (byte)nVars_00;
            if (nInputs < 7) {
              uVar4 = *pCur;
              bVar6 = (char)(-1 << (bVar7 & 0x1f)) + (char)(1 << (bVar6 & 0x1f));
              *pCur = (uVar4 & *(ulong *)(lVar10 * 0x90 + 0x9daf70 + uVar13 * 0x18)) >>
                      (bVar6 & 0x3f) |
                      (*(ulong *)(lVar10 * 0x90 + 0x9daf68 + uVar13 * 0x18) & uVar4) <<
                      (bVar6 & 0x3f) | s_PPMasks[lVar10][uVar13][0] & uVar4;
            }
            else if (uVar13 < 6) {
              if (iVar8 != 0x1f) {
                bVar6 = (char)(1 << (bVar6 & 0x1f)) + (char)(-1 << (bVar7 & 0x1f));
                uVar4 = s_PPMasks[lVar10][uVar13][0];
                uVar19 = *(ulong *)(lVar10 * 0x90 + 0x9daf68 + uVar13 * 0x18);
                uVar21 = *(ulong *)(lVar10 * 0x90 + 0x9daf70 + uVar13 * 0x18);
                uVar17 = 0;
                do {
                  uVar1 = pCur[uVar17];
                  pCur[uVar17] = (uVar1 & uVar21) >> (bVar6 & 0x3f) |
                                 (uVar1 & uVar19) << (bVar6 & 0x3f) | uVar1 & uVar4;
                  uVar17 = uVar17 + 1;
                } while (uVar12 != uVar17);
              }
            }
            else if ((int)nVars_00 < 6) {
              if (iVar8 != 0x1f) {
                bVar6 = (byte)(uVar13 - 6);
                uVar3 = 1 << (bVar6 & 0x1f);
                iVar14 = 2 << (bVar6 & 0x1f);
                uVar4 = 1;
                if (1 < (int)uVar3) {
                  uVar4 = (ulong)uVar3;
                }
                pwVar15 = pCur + (int)uVar3;
                pwVar16 = pCur;
                do {
                  if (uVar13 - 6 != 0x1f) {
                    uVar19 = s_Truths6[lVar10];
                    uVar21 = 0;
                    do {
                      uVar17 = pwVar16[uVar21];
                      bVar6 = (byte)(1 << (bVar7 & 0x1f));
                      uVar1 = pwVar15[uVar21];
                      pwVar16[uVar21] = uVar17 & ~uVar19 | uVar1 << (bVar6 & 0x3f) & uVar19;
                      pwVar15[uVar21] = uVar1 & uVar19 | (uVar17 & uVar19) >> (bVar6 & 0x3f);
                      uVar21 = uVar21 + 1;
                    } while (uVar4 != uVar21);
                  }
                  pwVar16 = pwVar16 + iVar14;
                  pwVar15 = pwVar15 + iVar14;
                } while (pwVar16 < pwVar9);
              }
            }
            else if (iVar8 != 0x1f) {
              bVar6 = (byte)(uVar13 - 6);
              bVar7 = (byte)(nVars_00 - 6);
              uVar3 = 1 << (bVar7 & 0x1f);
              iVar14 = 2 << (bVar6 & 0x1f);
              uVar4 = 1;
              if (1 < (int)uVar3) {
                uVar4 = (ulong)uVar3;
              }
              lVar18 = (long)(2 << (bVar7 & 0x1f));
              lVar10 = (long)(1 << (bVar6 & 0x1f));
              pwVar15 = pCur + lVar10;
              pwVar20 = pCur + (int)uVar3;
              pwVar16 = pCur;
              do {
                if (uVar13 - 6 != 0x1f) {
                  lVar11 = 0;
                  pwVar5 = pwVar15;
                  pwVar22 = pwVar20;
                  do {
                    if (nVars_00 - 6 != 0x1f) {
                      uVar19 = 0;
                      do {
                        wVar2 = pwVar22[uVar19];
                        pwVar22[uVar19] = pwVar5[uVar19];
                        pwVar5[uVar19] = wVar2;
                        uVar19 = uVar19 + 1;
                      } while (uVar4 != uVar19);
                    }
                    lVar11 = lVar11 + lVar18;
                    pwVar5 = pwVar5 + lVar18;
                    pwVar22 = pwVar22 + lVar18;
                  } while (lVar11 < lVar10);
                }
                pwVar16 = pwVar16 + iVar14;
                pwVar15 = pwVar15 + iVar14;
                pwVar20 = pwVar20 + iVar14;
              } while (pwVar16 < pwVar9);
            }
          }
          nVars_00 = nVars_00 + 1;
        }
      }
      else if (uVar13 < 6) {
        if (iVar8 != 0x1f) {
          uVar4 = 0;
          do {
            if (((pCur[uVar4] >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^ pCur[uVar4]) &
                s_Truths6Neg[uVar13]) != 0) goto LAB_00512ebf;
            uVar4 = uVar4 + 1;
          } while (uVar12 != uVar4);
        }
      }
      else if (iVar8 != 0x1f) {
        bVar7 = (byte)(uVar13 - 6);
        uVar3 = 1 << (bVar7 & 0x1f);
        iVar14 = 2 << (bVar7 & 0x1f);
        uVar4 = 1;
        if (1 < (int)uVar3) {
          uVar4 = (ulong)uVar3;
        }
        pwVar15 = pCur + (int)uVar3;
        pwVar16 = pCur;
        do {
          if (uVar13 - 6 != 0x1f) {
            uVar19 = 0;
            do {
              if (pwVar16[uVar19] != pwVar15[uVar19]) goto LAB_00512ebf;
              uVar19 = uVar19 + 1;
            } while (uVar4 != uVar19);
          }
          pwVar16 = pwVar16 + iVar14;
          pwVar15 = pwVar15 + iVar14;
        } while (pwVar16 < pwVar9);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)nVars);
  }
  if (nVars < (int)nVars_00) {
    __assert_fail("k < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda,pMan,pCur,nVars_00,local_48,99);
  iVar8 = vTtMem->nEntries;
  Vec_MemHashInsert(vTtMem,pCur);
  iVar14 = 0;
  if (iVar8 != vTtMem->nEntries) {
    Vec_IntPush(vNodSup,nVars_00 | nNodes << 0x10);
    iVar8 = vNodSup->nSize;
    if (vTtMem->nEntries != iVar8) {
      __assert_fail("Vec_MemEntryNum(vTtMem) == Vec_IntSize(vNodSup)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                    ,0x269,
                    "int Dau_InsertFunction(Abc_TtHieMan_t *, word *, int, int, int, int, Vec_Mem_t *, Vec_Int_t *, int, abctime)"
                   );
    }
    iVar14 = 1;
    if ((iVar8 * 0x68c26139 + 0x218c0U >> 6 | iVar8 * -0x1c000000) < 0x10c7) {
      Dau_TablesSave(nInputs,nVars0,vTtMem,vNodSup,nFronts,clk);
    }
  }
  return iVar14;
}

Assistant:

int Dau_InsertFunction( Abc_TtHieMan_t * pMan, word * pCur, int nNodes, int nInputs, int nVars0, int nVars, 
    Vec_Mem_t * vTtMem, Vec_Int_t * vNodSup, int nFronts, abctime clk )
{
    int DumpDelta = 1000000;
    char Perm[16] = {0};
    int nVarsNew = Abc_TtMinBase( pCur, NULL, nVars, nInputs );
    //unsigned Phase = Abc_TtCanonicizeHie( pMan, pCur, nVarsNew, Perm, 1 );
    unsigned Phase = Abc_TtCanonicizeWrap( Abc_TtCanonicizeAda, pMan, pCur, nVarsNew, Perm, 99 );
    int nEntries = Vec_MemEntryNum(vTtMem);
    int Entry = Vec_MemHashInsert( vTtMem, pCur );
    if ( nEntries == Vec_MemEntryNum(vTtMem) ) // found in the table - not new
        return 0;
    Entry = 0;
    Phase = 0;
    // this is a new class
    Vec_IntPush( vNodSup, (nNodes << 16) | nVarsNew );
    assert( Vec_MemEntryNum(vTtMem) == Vec_IntSize(vNodSup) );
    if ( Vec_IntSize(vNodSup) % DumpDelta == 0 )
        Dau_TablesSave( nInputs, nVars0, vTtMem, vNodSup, nFronts, clk );
    return 1;
}